

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftRightOperator,bool,false,true>
               (hugeint_t *ldata,hugeint_t *rdata,hugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  uint64_t *puVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  uint64_t uVar4;
  int64_t iVar5;
  hugeint_t shift;
  hugeint_t shift_00;
  ulong uVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  hugeint_t hVar14;
  int64_t in_stack_ffffffffffffff68;
  hugeint_t local_88;
  hugeint_t local_78;
  ulong local_68;
  ValidityMask *local_60;
  hugeint_t *local_58;
  hugeint_t *local_50;
  hugeint_t local_48;
  idx_t local_38;
  
  local_58 = rdata;
  local_50 = ldata;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar4 = rdata->lower;
      iVar5 = rdata->upper;
      lVar10 = 0;
      do {
        puVar1 = (uint64_t *)((long)&local_50->lower + lVar10);
        local_48.lower = *puVar1;
        local_48.upper = puVar1[1];
        hVar14.upper = in_stack_ffffffffffffff68;
        hVar14.lower = 0x1c2495d;
        local_88.lower = uVar4;
        local_88.upper = iVar5;
        bVar7 = RightShiftInRange<duckdb::hugeint_t>(hVar14);
        if (bVar7) {
          hVar14 = hugeint_t::operator>>(&local_48,&local_88);
        }
        else {
          hugeint_t::hugeint_t(&local_78,0);
          hVar14 = local_78;
        }
        *(uint64_t *)((long)&result_data->lower + lVar10) = hVar14.lower;
        *(int64_t *)((long)&result_data->upper + lVar10) = hVar14.upper;
        lVar10 = lVar10 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar8 = count + 0x3f >> 6;
    uVar11 = 0;
    uVar9 = 0;
    local_68 = uVar8;
    local_60 = mask;
    local_38 = count;
    do {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar12 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar12 = count;
        }
LAB_01c2486e:
        uVar6 = uVar11;
        if (uVar11 < uVar12) {
          uVar4 = local_58->lower;
          iVar5 = local_58->upper;
          lVar10 = uVar11 << 4;
          do {
            puVar1 = (uint64_t *)((long)&local_50->lower + lVar10);
            local_48.lower = *puVar1;
            local_48.upper = puVar1[1];
            shift_00.upper = in_stack_ffffffffffffff68;
            shift_00.lower = 0x1c248b3;
            local_88.lower = uVar4;
            local_88.upper = iVar5;
            bVar7 = RightShiftInRange<duckdb::hugeint_t>(shift_00);
            if (bVar7) {
              hVar14 = hugeint_t::operator>>(&local_48,&local_88);
            }
            else {
              hugeint_t::hugeint_t(&local_78,0);
              hVar14 = local_78;
            }
            *(uint64_t *)((long)&result_data->lower + lVar10) = hVar14.lower;
            *(int64_t *)((long)&result_data->upper + lVar10) = hVar14.upper;
            uVar11 = uVar11 + 1;
            lVar10 = lVar10 + 0x10;
            uVar8 = local_68;
            mask = local_60;
            uVar6 = uVar12;
            count = local_38;
          } while (uVar12 != uVar11);
        }
      }
      else {
        uVar3 = puVar2[uVar9];
        uVar12 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar12 = count;
        }
        uVar6 = uVar12;
        if (uVar3 != 0) {
          if (uVar3 == 0xffffffffffffffff) goto LAB_01c2486e;
          uVar8 = local_68;
          mask = local_60;
          uVar6 = uVar11;
          if (uVar11 < uVar12) {
            lVar10 = uVar11 << 4;
            uVar13 = 0;
            do {
              if ((uVar3 >> (uVar13 & 0x3f) & 1) != 0) {
                local_88.lower = local_58->lower;
                local_88.upper = local_58->upper;
                puVar1 = (uint64_t *)((long)&local_50->lower + lVar10);
                local_48.lower = *puVar1;
                local_48.upper = puVar1[1];
                shift.upper = in_stack_ffffffffffffff68;
                shift.lower = 0x1c2481e;
                bVar7 = RightShiftInRange<duckdb::hugeint_t>(shift);
                if (bVar7) {
                  hVar14 = hugeint_t::operator>>(&local_48,&local_88);
                }
                else {
                  hugeint_t::hugeint_t(&local_78,0);
                  hVar14 = local_78;
                }
                *(uint64_t *)((long)&result_data->lower + lVar10) = hVar14.lower;
                *(int64_t *)((long)&result_data->upper + lVar10) = hVar14.upper;
              }
              uVar13 = uVar13 + 1;
              lVar10 = lVar10 + 0x10;
              uVar8 = local_68;
              mask = local_60;
              uVar6 = uVar12;
              count = local_38;
            } while (uVar12 - uVar11 != uVar13);
          }
        }
      }
      uVar11 = uVar6;
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar8);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}